

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O0

void Ivy_FraigSimulateOne(Ivy_FraigMan_t *p)

{
  int iVar1;
  abctime aVar2;
  Ivy_Obj_t *pObj_00;
  abctime aVar3;
  abctime clk;
  int i;
  Ivy_Obj_t *pObj;
  Ivy_FraigMan_t *p_local;
  
  aVar2 = Abc_Clock();
  for (clk._4_4_ = 0; iVar1 = Vec_PtrSize(p->pManAig->vObjs), clk._4_4_ < iVar1;
      clk._4_4_ = clk._4_4_ + 1) {
    pObj_00 = (Ivy_Obj_t *)Vec_PtrEntry(p->pManAig->vObjs,clk._4_4_);
    if ((pObj_00 != (Ivy_Obj_t *)0x0) && (iVar1 = Ivy_ObjIsNode(pObj_00), iVar1 != 0)) {
      Ivy_NodeSimulate(p,pObj_00);
    }
  }
  aVar3 = Abc_Clock();
  p->timeSim = (aVar3 - aVar2) + p->timeSim;
  p->nSimRounds = p->nSimRounds + 1;
  return;
}

Assistant:

void Ivy_FraigSimulateOne( Ivy_FraigMan_t * p )
{
    Ivy_Obj_t * pObj;
    int i;
    abctime clk;
clk = Abc_Clock();
    Ivy_ManForEachNode( p->pManAig, pObj, i )
    {
        Ivy_NodeSimulate( p, pObj );
/*
        if ( Ivy_ObjFraig(pObj) == NULL )
            printf( "%3d --- -- %d  :  ", pObj->Id, pObj->fPhase );
        else
            printf( "%3d %3d %2d %d  :  ", pObj->Id, Ivy_Regular(Ivy_ObjFraig(pObj))->Id, Ivy_ObjSatNum(Ivy_Regular(Ivy_ObjFraig(pObj))), pObj->fPhase );
        Extra_PrintBinary( stdout, Ivy_ObjSim(pObj), 30 );
        printf( "\n" );
*/
    }
p->timeSim += Abc_Clock() - clk;
p->nSimRounds++;
}